

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

String * __thiscall
Rml::DataAddressToString_abi_cxx11_(String *__return_storage_ptr__,Rml *this,DataAddress *address)

{
  bool bVar1;
  bool bVar2;
  int *value;
  String local_c0;
  String local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reference local_40;
  DataAddressEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  DataAddress *__range1;
  bool is_first;
  DataAddress *address_local;
  String *result;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = true;
  __end1 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::begin
                     ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)this)
  ;
  entry = (DataAddressEntry *)
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::end
                    ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
                                     *)&entry), bVar2) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
               ::operator*(&__end1);
    if (local_40->index < 0) {
      if (!bVar1) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_40);
    }
    else {
      value = &local_40->index;
      ::std::__cxx11::string::string((string *)&local_c0);
      ToString<int>(&local_a0,value,&local_c0);
      ::std::operator+(&local_80,'[',&local_a0);
      ::std::operator+(&local_60,&local_80,']');
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static String DataAddressToString(const DataAddress& address)
{
	String result;
	bool is_first = true;
	for (auto& entry : address)
	{
		if (entry.index >= 0)
			result += '[' + ToString(entry.index) + ']';
		else
		{
			if (!is_first)
				result += ".";
			result += entry.name;
		}
		is_first = false;
	}
	return result;
}